

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZNLMultGridAnalysis.cpp
# Opt level: O2

void __thiscall
TPZNonLinMultGridAnalysis::SmoothingSolution
          (TPZNonLinMultGridAnalysis *this,REAL tol,int numiter,TPZMaterial *matbase,
          TPZLinearAnalysis *an,int marcha,string *dxout)

{
  TPZCompMesh *CompMesh;
  TPZBaseMatrix *pTVar1;
  ostream *poVar2;
  int iVar3;
  STATE SVar4;
  TPZMaterial *local_70;
  _Any_data local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (matbase == (TPZMaterial *)0x0) {
    local_70 = (TPZMaterial *)0x0;
  }
  else {
    local_70 = (TPZMaterial *)
               __dynamic_cast(matbase,&TPZMaterial::typeinfo,&TPZMaterialT<double>::typeinfo,0);
  }
  if (numiter < 1) {
    std::operator<<((ostream *)&std::cout,anon_var_dwarf_209222c);
    pTVar1 = (an->super_TPZAnalysis).fSolution.fBaseMatrix;
    if (pTVar1 != (TPZBaseMatrix *)0x0) {
      (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[0xf])();
      return;
    }
  }
  else {
    if (marcha != 0) {
      SmoothingSolution2(this,tol,numiter,local_70,an,marcha,dxout);
      return;
    }
    CompMesh = (an->super_TPZAnalysis).fCompMesh;
    std::operator<<((ostream *)&std::cout,
                    "PZAnalysis::SmoothingSolutionTest beginning of the iterative process\n");
    pTVar1 = (an->super_TPZAnalysis).fSolution.fBaseMatrix;
    if (pTVar1 != (TPZBaseMatrix *)0x0) {
      (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[0xf])();
    }
    SetDeltaTime(this,CompMesh,local_70);
    (*(an->super_TPZAnalysis).super_TPZSavable._vptr_TPZSavable[0xb])(an,&std::cout);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "TPZNonLinMultGridAnalysis::SmoothingSolution iteration = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
    std::endl<char,std::char_traits<char>>(poVar2);
    (*(an->super_TPZAnalysis).super_TPZSavable._vptr_TPZSavable[0xc])(an);
    local_48 = 0;
    uStack_40 = 0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    (**(code **)(*(long *)local_70 + 0xa0))(local_70,&local_58,0xffffffffffffffff);
    std::_Function_base::~_Function_base((_Function_base *)&local_58);
    iVar3 = 2;
    while( true ) {
      SVar4 = Norm(&(this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution);
      if ((numiter <= iVar3 + -1) || (tol <= SVar4)) break;
      pTVar1 = (an->super_TPZAnalysis).fSolution.fBaseMatrix;
      if (pTVar1 != (TPZBaseMatrix *)0x0) {
        (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[0xf])();
      }
      SetDeltaTime(this,CompMesh,local_70);
      (*(an->super_TPZAnalysis).super_TPZSavable._vptr_TPZSavable[0xb])(an,&std::cout);
      (*(an->super_TPZAnalysis).super_TPZSavable._vptr_TPZSavable[0xc])(an);
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "TPZNonLinMultGridAnalysis::SmoothingSolution iteracao = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
      std::endl<char,std::char_traits<char>>(poVar2);
      iVar3 = iVar3 + 1;
    }
    if (iVar3 + -1 < numiter) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "\nTPZNonLinMultGridAnalysis::SmoothingSolution the iterative process stopped"
                              );
      std::operator<<(poVar2," due the great norm of the solution, norm solution = ");
      poVar2 = std::ostream::_M_insert<double>(SVar4);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    (*(an->super_TPZAnalysis).super_TPZSavable._vptr_TPZSavable[0xc])(an);
  }
  return;
}

Assistant:

void TPZNonLinMultGridAnalysis::SmoothingSolution(REAL tol,int numiter,TPZMaterial * matbase,
												  TPZLinearAnalysis &an,int marcha,const std::string &dxout) {
	auto *mat =
		dynamic_cast<TPZMaterialT<STATE>*>(matbase);
	if(numiter <= 0){
		cout << "PZAnalysis::SmoothingSolution NENHUMA RESOLU�O EFETUADA\n";
		an.Solution().Zero();
		return;
	}
	if(marcha){
		//saida com o DX
		SmoothingSolution2(tol,numiter,mat,an,marcha,dxout);
		return;
	}
	TPZCompMesh *anmesh = an.Mesh();
	cout << "PZAnalysis::SmoothingSolutionTest beginning of the iterative process\n";
	int iter = 0;
	an.Solution().Zero();
	SetDeltaTime(anmesh,mat);
	an.Run();
	cout << "TPZNonLinMultGridAnalysis::SmoothingSolution iteration = " << ++iter << endl;
	an.LoadSolution();
	mat->SetForcingFunction(nullptr,-1);
	REAL normsol = Norm(Solution());
	
	while(iter < numiter && normsol < tol) {
		
		an.Solution().Zero();
		SetDeltaTime(anmesh,mat);
		an.Run();
		an.LoadSolution();
		cout << "TPZNonLinMultGridAnalysis::SmoothingSolution iteracao = " << ++iter << endl;
		normsol = Norm(Solution());
	}
	if(iter < numiter){
		cout << "\nTPZNonLinMultGridAnalysis::SmoothingSolution the iterative process stopped"
		<< " due the great norm of the solution, norm solution = " << normsol << endl;
	}
	an.LoadSolution();
}